

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::Generator::FixAllDescriptorOptions(Generator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  FileDescriptor *pFVar3;
  long lVar4;
  long lVar5;
  string file_options;
  string local_58;
  string local_38;
  
  MessageLite::SerializeAsString_abi_cxx11_(&local_58,*(MessageLite **)(this->file_ + 0x88));
  OptionsValue(&local_38,this,&local_58);
  paVar1 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_38);
  if (iVar2 != 0) {
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"DESCRIPTOR","");
    io::Printer::Print<char[11],std::__cxx11::string>
              (this->printer_,"$descriptor$._options = None\n",(char (*) [11])0x3ea5a2,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  pFVar3 = this->file_;
  if (0 < *(int *)(pFVar3 + 0x30)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      FixOptionsForEnum(this,(EnumDescriptor *)(*(long *)(pFVar3 + 0x70) + lVar4));
      lVar5 = lVar5 + 1;
      pFVar3 = this->file_;
      lVar4 = lVar4 + 0x50;
    } while (lVar5 < *(int *)(pFVar3 + 0x30));
  }
  if (0 < *(int *)(pFVar3 + 0x38)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      FixOptionsForField(this,(FieldDescriptor *)(*(long *)(pFVar3 + 0x80) + lVar4));
      lVar5 = lVar5 + 1;
      pFVar3 = this->file_;
      lVar4 = lVar4 + 0x98;
    } while (lVar5 < *(int *)(pFVar3 + 0x38));
  }
  if (0 < *(int *)(pFVar3 + 0x2c)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      FixOptionsForMessage(this,(Descriptor *)(*(long *)(pFVar3 + 0x68) + lVar4));
      lVar5 = lVar5 + 1;
      pFVar3 = this->file_;
      lVar4 = lVar4 + 0x90;
    } while (lVar5 < *(int *)(pFVar3 + 0x2c));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Generator::FixAllDescriptorOptions() const {
  // Prints an expression that sets the file descriptor's options.
  std::string file_options = OptionsValue(file_->options().SerializeAsString());
  if (file_options != "None") {
    PrintDescriptorOptionsFixingCode(kDescriptorKey, file_options, printer_);
  }
  // Prints expressions that set the options for all top level enums.
  for (int i = 0; i < file_->enum_type_count(); ++i) {
    const EnumDescriptor& enum_descriptor = *file_->enum_type(i);
    FixOptionsForEnum(enum_descriptor);
  }
  // Prints expressions that set the options for all top level extensions.
  for (int i = 0; i < file_->extension_count(); ++i) {
    const FieldDescriptor& field = *file_->extension(i);
    FixOptionsForField(field);
  }
  // Prints expressions that set the options for all messages, nested enums,
  // nested extensions and message fields.
  for (int i = 0; i < file_->message_type_count(); ++i) {
    FixOptionsForMessage(*file_->message_type(i));
  }
}